

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinSerializer<std::vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>,_void>
     ::serialize<OutputStream>
               (vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                *s,OutputStream *ostream)

{
  pointer pdVar1;
  deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *elem;
  pointer s_00;
  int local_1c;
  
  local_1c = (int)((ulong)((long)(s->
                                 super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(s->
                                super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  pdVar1 = (s->
           super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (s_00 = (s->
              super__Vector_base<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; s_00 != pdVar1; s_00 = s_00 + 1) {
    BuiltinSerializer<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_void>
    ::serialize<OutputStream>(s_00,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }